

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_color nk_rgb(int r,int g,int b)

{
  int iVar1;
  
  if (0xfe < r) {
    r = 0xff;
  }
  if (r < 1) {
    r = 0;
  }
  if (0xfe < g) {
    g = 0xff;
  }
  if (g < 1) {
    g = 0;
  }
  iVar1 = 0xff;
  if (b < 0xff) {
    iVar1 = b;
  }
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  return (nk_color)(iVar1 << 0x10 | g << 8 | r | 0xff000000);
}

Assistant:

NK_API struct nk_color
nk_rgb(int r, int g, int b)
{
    struct nk_color ret;
    ret.r = (nk_byte)NK_CLAMP(0, r, 255);
    ret.g = (nk_byte)NK_CLAMP(0, g, 255);
    ret.b = (nk_byte)NK_CLAMP(0, b, 255);
    ret.a = (nk_byte)255;
    return ret;
}